

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
::Impl<1UL,_false>::insert
          (Impl<1UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,SiPair *row,uint skip)

{
  RemoveConst<kj::StringPtr> **ppRVar1;
  uint uVar2;
  int iVar3;
  StringPtr *pSVar4;
  ArrayDisposer *in_RAX;
  long lVar5;
  ArrayDisposer *extraout_RAX;
  uint uVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  uint uVar8;
  ArrayDisposer *pAVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar10;
  Maybe<unsigned_long> MVar11;
  bool local_71;
  Impl<1UL,_false> *local_70;
  size_t local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  if (skip != 1) {
    pSVar4 = (table->rows).builder.ptr;
    lVar5 = (long)(table->rows).builder.pos - (long)pSVar4 >> 3;
    uVar2 = row->i;
    in_RAX = table[1].rows.builder.disposer;
    local_68 = pos;
    if ((ulong)((long)in_RAX * 2) <
        ((long)table[1].rows.builder.pos + lVar5 * -0x5555555555555555) * 3 + 3U) {
      local_70 = this;
      HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>::rehash
                ((HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher> *)(table + 1),lVar5 + 3);
      in_RAX = table[1].rows.builder.disposer;
      this = local_70;
    }
    uVar6 = uVar2 * 0x8000 + ~uVar2;
    uVar6 = (uVar6 >> 0xc ^ uVar6) * 5;
    uVar6 = (uVar6 >> 4 ^ uVar6) * 0x809;
    uVar6 = uVar6 >> 0x10 ^ uVar6;
    uVar8 = (int)in_RAX - 1U & uVar6;
    aVar7.value = 0;
LAB_00156fcf:
    aVar10.value = (unsigned_long)(&((table[1].rows.builder.endPtr)->content).ptr + uVar8);
    iVar3 = *(int *)(aVar10.value + 4);
    if (iVar3 == 1) {
      if ((char **)aVar7.value == (char **)0x0) {
        aVar7.value = aVar10.value;
      }
    }
    else {
      if (iVar3 == 0) {
        if ((char **)aVar7.value != (char **)0x0) {
          ppRVar1 = &table[1].rows.builder.pos;
          *ppRVar1 = (RemoveConst<kj::StringPtr> *)((long)&(*ppRVar1)[-1].content.size_ + 7);
          aVar10 = aVar7;
        }
        *(char **)aVar10 = (char *)(((ulong)uVar6 | pos << 0x20) + 0x200000000);
        local_60.maybeFunc.ptr.isSet = true;
        local_60.maybeFunc.ptr.field_1.value.success = &local_71;
        local_60.maybeFunc.ptr.field_1.value.pos = &local_68;
        *this = (Impl<1UL,_false>)0x0;
        local_71 = true;
        local_60.maybeFunc.ptr.field_1.value.indexObj =
             (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(table + 1);
        local_60.maybeFunc.ptr.field_1.value.table = table;
        local_60.maybeFunc.ptr.field_1.value.row = &row->str;
        _::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
        ::~Deferred(&local_60);
        in_RAX = extraout_RAX;
        aVar7 = extraout_RDX;
        goto LAB_0015706d;
      }
      if ((*(uint *)aVar10 == uVar6) &&
         (*(uint *)((long)pSVar4 + (ulong)(iVar3 - 2) * 0x18 + 0x10) == uVar2)) goto LAB_00157066;
    }
    pAVar9 = (ArrayDisposer *)((ulong)uVar8 + 1);
    uVar8 = (uint)pAVar9;
    if (pAVar9 == in_RAX) {
      uVar8 = 0;
    }
    goto LAB_00156fcf;
  }
  *this = (Impl<1UL,_false>)0x0;
  aVar7 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pos;
LAB_0015706d:
  MVar11.ptr.field_1.value = aVar7.value;
  MVar11.ptr._0_8_ = in_RAX;
  return (Maybe<unsigned_long>)MVar11.ptr;
LAB_00157066:
  *this = (Impl<1UL,_false>)0x1;
  *(ulong *)(this + 8) = (ulong)(iVar3 - 2);
  goto LAB_0015706d;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }